

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O3

Fl_Tree_Item * __thiscall Fl_Tree_Item::find_child_item(Fl_Tree_Item *this,char *name)

{
  Fl_Tree_Item **ppFVar1;
  Fl_Tree_Item *pFVar2;
  char *__s1;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if ((name != (char *)0x0) && (lVar5 = (long)(this->_children)._total, 0 < lVar5)) {
    ppFVar1 = (this->_children)._items;
    lVar4 = 0;
    do {
      pFVar2 = ppFVar1[lVar4];
      __s1 = pFVar2->_label;
      if ((__s1 != (char *)0x0) && (iVar3 = strcmp(__s1,name), iVar3 == 0)) {
        return pFVar2;
      }
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  return (Fl_Tree_Item *)0x0;
}

Assistant:

const Fl_Tree_Item* Fl_Tree_Item::find_child_item(const char *name) const {
  if ( name )
    for ( int t=0; t<children(); t++ )
      if ( child(t)->label() )
        if ( strcmp(child(t)->label(), name) == 0 )
          return(child(t));
  return(0);
}